

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzcompelpostproc.h
# Opt level: O2

void __thiscall
TPZCompElPostProc<TPZCompElH1<pzshape::TPZShapePoint>_>::CalcResidualInternal<double>
          (TPZCompElPostProc<TPZCompElH1<pzshape::TPZShapePoint>_> *this,
          TPZElementMatrixT<double> *ef)

{
  TPZCompElPostProc<TPZCompElH1<pzshape::TPZShapePoint>_> *pTVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  TPZCompEl *pTVar5;
  long *plVar6;
  long lVar7;
  TPZPostProcMat *this_00;
  TPZGeoEl *pTVar8;
  ostream *poVar9;
  double *pdVar10;
  ulong uVar11;
  ulong row;
  int i_sh;
  ulong uVar12;
  ulong uVar13;
  double dVar14;
  REAL weight;
  ulong uStack_10c98;
  long *plStack_10c90;
  TPZElementMatrixT<double> *pTStack_10c88;
  double dStack_10c80;
  REAL weightRef;
  int iStack_10c6c;
  long lStack_10c68;
  long *plStack_10c60;
  long *plStack_10c58;
  long *plStack_10c50;
  long lStack_10c48;
  ulong uStack_10c40;
  long *plStack_10c38;
  TPZCompElPostProc<TPZCompElH1<pzshape::TPZShapePoint>_> *pTStack_10c30;
  TPZPostProcMat *pTStack_10c28;
  TPZVec<double> Sol;
  TPZManVector<double,_3> intpointRef;
  TPZManVector<double,_3> intpoint;
  TPZManVector<int,_10> varIndex;
  TPZFNMatrix<1,_double> efTemp;
  TPZFNMatrix<10,_double> ekTemp;
  TPZFNMatrix<10,_double> rhsTemp;
  TPZFNMatrix<9,_double> rhsCopy;
  TPZFNMatrix<90,_double> ekCopy;
  TPZMaterialDataT<double> dataRef;
  TPZMaterialDataT<double> data;
  
  plVar6 = (long *)0x0;
  TPZElementMatrixT<double>::Reset(ef,(TPZCompMesh *)0x0,Unknown);
  pTStack_10c88 = ef;
  (**(code **)(*(long *)&(this->super_TPZCompElH1<pzshape::TPZShapePoint>).
                         super_TPZIntelGen<pzshape::TPZShapePoint>.super_TPZInterpolatedElement.
                         super_TPZInterpolationSpace.super_TPZCompEl + 0x100))(this,ef);
  pTVar5 = ReferredElement(this);
  plStack_10c90 = (long *)0x0;
  if (pTVar5 != (TPZCompEl *)0x0) {
    plVar6 = (long *)__dynamic_cast(pTVar5,&TPZCompEl::typeinfo,&TPZInterpolationSpace::typeinfo,0);
    plStack_10c90 =
         (long *)__dynamic_cast(pTVar5,&TPZCompEl::typeinfo,&TPZMultiphysicsElement::typeinfo,0);
  }
  lVar7 = (**(code **)(*(long *)&(this->super_TPZCompElH1<pzshape::TPZShapePoint>).
                                 super_TPZIntelGen<pzshape::TPZShapePoint>.
                                 super_TPZInterpolatedElement.super_TPZInterpolationSpace.
                                 super_TPZCompEl + 0xb8))(this);
  if (lVar7 != 0) {
    this_00 = (TPZPostProcMat *)
              __dynamic_cast(lVar7,&TPZMaterial::typeinfo,&TPZPostProcMat::typeinfo,0);
    if (this_00 != (TPZPostProcMat *)0x0) {
      lVar7 = (**(code **)(*(long *)pTVar5 + 0xb8))(pTVar5);
      if (lVar7 == 0) {
        plStack_10c50 = (long *)0x0;
      }
      else {
        plStack_10c50 =
             (long *)__dynamic_cast(lVar7,&TPZMaterial::typeinfo,
                                    &TPZMatSingleSpaceT<double>::typeinfo,0xfffffffffffffffe);
      }
      iVar2 = (**(code **)(*(long *)&(this->super_TPZCompElH1<pzshape::TPZShapePoint>).
                                     super_TPZIntelGen<pzshape::TPZShapePoint>.
                                     super_TPZInterpolatedElement.super_TPZInterpolationSpace.
                                     super_TPZCompEl + 0x90))(this);
      if (iVar2 != 0) {
        data.super_TPZMaterialData.super_TPZShapeData._0_8_ = 0;
        TPZFNMatrix<1,_double>::TPZFNMatrix
                  (&efTemp,(pTStack_10c88->fMat).super_TPZFMatrix<double>.super_TPZMatrix<double>.
                           super_TPZBaseMatrix.fRow,1,(double *)&data);
        TPZMaterialDataT<double>::TPZMaterialDataT(&data);
        TPZMaterialDataT<double>::TPZMaterialDataT(&dataRef);
        (**(code **)(*(long *)&(this->super_TPZCompElH1<pzshape::TPZShapePoint>).
                               super_TPZIntelGen<pzshape::TPZShapePoint>.
                               super_TPZInterpolatedElement.super_TPZInterpolationSpace.
                               super_TPZCompEl + 0x298))(this,&data);
        if (plVar6 != (long *)0x0) {
          (**(code **)(*plVar6 + 0x298))(plVar6,&dataRef);
          dataRef.super_TPZMaterialData.fNeedsSol = true;
          dataRef.super_TPZMaterialData.p = (**(code **)(*plVar6 + 0x268))(plVar6);
        }
        data.super_TPZMaterialData.p =
             (**(code **)(*(long *)&(this->super_TPZCompElH1<pzshape::TPZShapePoint>).
                                    super_TPZIntelGen<pzshape::TPZShapePoint>.
                                    super_TPZInterpolatedElement.super_TPZInterpolationSpace.
                                    super_TPZCompEl + 0x268))(this);
        pTVar8 = TPZCompEl::Reference((TPZCompEl *)this);
        iVar2 = (**(code **)(*(long *)pTVar8 + 0x210))(pTVar8);
        ekCopy.super_TPZFMatrix<double>.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable
        ._vptr_TPZSavable = (_func_int **)0x0;
        TPZManVector<double,_3>::TPZManVector(&intpoint,(long)iVar2,(double *)&ekCopy);
        ekCopy.super_TPZFMatrix<double>.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable
        ._vptr_TPZSavable = (_func_int **)0x0;
        TPZManVector<double,_3>::TPZManVector(&intpointRef,(long)iVar2,(double *)&ekCopy);
        weight = 0.0;
        weightRef = 0.0;
        (**(code **)(*(long *)&(this->super_TPZCompElH1<pzshape::TPZShapePoint>).
                               super_TPZIntelGen<pzshape::TPZShapePoint>.
                               super_TPZInterpolatedElement.super_TPZInterpolationSpace.
                               super_TPZCompEl + 0x2c8))(this);
        plStack_10c58 =
             (long *)(**(code **)(*(long *)&(this->super_TPZCompElH1<pzshape::TPZShapePoint>).
                                            super_TPZIntelGen<pzshape::TPZShapePoint>.
                                            super_TPZInterpolatedElement.super_TPZInterpolationSpace
                                            .super_TPZCompEl + 0x2c8))(this);
        plStack_10c60 = (long *)(**(code **)(*(long *)pTVar5 + 0x240))(pTVar5);
        iVar2 = (**(code **)(*plStack_10c58 + 0x18))();
        iVar3 = (**(code **)(*plStack_10c60 + 0x18))();
        if (iVar2 == iVar3) {
          uStack_10c40 = (**(code **)(*(long *)&(this->super_TPZCompElH1<pzshape::TPZShapePoint>).
                                                super_TPZIntelGen<pzshape::TPZShapePoint>.
                                                super_TPZInterpolatedElement.
                                                super_TPZInterpolationSpace.super_TPZCompEl + 600))
                                   (this);
          lStack_10c68 = (long)(int)uStack_10c40;
          ekCopy.super_TPZFMatrix<double>.super_TPZMatrix<double>.super_TPZBaseMatrix.
          super_TPZSavable._vptr_TPZSavable = (_func_int **)0x0;
          TPZFNMatrix<10,_double>::TPZFNMatrix(&ekTemp,lStack_10c68,lStack_10c68,(double *)&ekCopy);
          TPZManVector<int,_10>::TPZManVector(&varIndex,0);
          TPZPostProcMat::GetPostProcessVarIndexList(this_00,&varIndex.super_TPZVec<int>);
          uStack_10c98 = (**(code **)(*(long *)&(this_00->
                                                super_TPZMatBase<double,_TPZMatSingleSpaceT<double>,_TPZMatInterfaceSingleSpace<double>_>
                                                ).super_TPZMaterialT<double>.super_TPZMaterial +
                                     0x78))(this_00);
          pTStack_10c88 = (TPZElementMatrixT<double> *)&pTStack_10c88->fMat;
          Sol._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01649128;
          Sol.fStore = (double *)0x0;
          Sol.fNElements = 0;
          Sol.fNAlloc = 0;
          if (iVar2 < 1) {
            iVar2 = 0;
          }
          lStack_10c48 = (long)(int)uStack_10c98;
          iStack_10c6c = iVar2;
          plStack_10c38 = plVar6;
          pTStack_10c30 = this;
          pTStack_10c28 = this_00;
          for (iVar3 = 0; pTVar1 = pTStack_10c30, plVar6 = plStack_10c38, iVar3 != iStack_10c6c;
              iVar3 = iVar3 + 1) {
            (**(code **)(*plStack_10c58 + 0x20))(plStack_10c58,iVar3,&intpoint,&weight);
            (**(code **)(*plStack_10c60 + 0x20))(plStack_10c60,iVar3,&intpointRef,&weightRef);
            dataRef.super_TPZMaterialData.intLocPtIndex = iVar3;
            data.super_TPZMaterialData.intLocPtIndex = iVar3;
            (**(code **)(*(long *)&(pTVar1->super_TPZCompElH1<pzshape::TPZShapePoint>).
                                   super_TPZIntelGen<pzshape::TPZShapePoint>.
                                   super_TPZInterpolatedElement.super_TPZInterpolationSpace.
                                   super_TPZCompEl + 0x2a8))(pTVar1,&data,&intpoint);
            dataRef.super_TPZMaterialData.intLocPtIndex = iVar3;
            if (plVar6 != (long *)0x0) {
              (**(code **)(*plVar6 + 0x290))(plVar6,&intpointRef,&dataRef);
              (**(code **)(*plVar6 + 0x2a8))(plVar6,&dataRef,&intpointRef);
            }
            if (plStack_10c90 != (long *)0x0) {
              (**(code **)(*plStack_10c90 + 0x2c8))(plStack_10c90,&dataRef,&intpointRef);
            }
            weight = ABS(data.super_TPZMaterialData.detjac) * weight;
            weightRef = ABS(dataRef.super_TPZMaterialData.detjac) * weightRef;
            ekCopy.super_TPZFMatrix<double>.super_TPZMatrix<double>.super_TPZBaseMatrix.
            super_TPZSavable._vptr_TPZSavable = (_func_int **)0x0;
            (*((data.sol.super_TPZVec<TPZManVector<double,_10>_>.fStore)->super_TPZVec<double>).
              _vptr_TPZVec[2])(data.sol.super_TPZVec<TPZManVector<double,_10>_>.fStore,lStack_10c48,
                               &ekCopy);
            uVar4 = (uint)varIndex.super_TPZVec<int>.fNElements;
            if ((int)(uint)varIndex.super_TPZVec<int>.fNElements < 1) {
              uVar4 = 0;
            }
            dStack_10c80 = (double)(ulong)uVar4;
            lVar7 = 0;
            for (dVar14 = 0.0; dVar14 != dStack_10c80; dVar14 = (double)((long)dVar14 + 1)) {
              iVar2 = varIndex.super_TPZVec<int>.fStore[(long)dVar14];
              plVar6 = (long *)(**(code **)(*(long *)pTVar5 + 0xb8))(pTVar5);
              uVar4 = (**(code **)(*plVar6 + 0x88))(plVar6,iVar2);
              uVar11 = (ulong)uVar4;
              TPZVec<double>::Resize(&Sol,(long)(int)uVar4);
              if (iVar2 < 99) {
                (**(code **)(*plStack_10c50 + 0x88))(plStack_10c50,&dataRef,iVar2,&Sol);
              }
              else {
                (**(code **)(*(long *)pTVar5 + 0x1b0))(pTVar5,&intpointRef,iVar2,&Sol);
              }
              if ((int)uVar4 < 1) {
                uVar11 = 0;
              }
              for (uVar13 = 0; uVar11 != uVar13; uVar13 = uVar13 + 1) {
                ((data.sol.super_TPZVec<TPZManVector<double,_10>_>.fStore)->super_TPZVec<double>).
                fStore[lVar7 + uVar13] = Sol.fStore[uVar13];
              }
              lVar7 = lVar7 + (int)uVar4;
            }
            (**(code **)(*(long *)&(pTStack_10c28->
                                   super_TPZMatBase<double,_TPZMatSingleSpaceT<double>,_TPZMatInterfaceSingleSpace<double>_>
                                   ).super_TPZMaterialT<double>.super_TPZMaterial + 200))
                      (weight,pTStack_10c28,&data,&ekTemp,&efTemp);
          }
          TPZFNMatrix<90,_double>::TPZFNMatrix(&ekCopy,&ekTemp.super_TPZFMatrix<double>);
          rhsCopy.super_TPZFMatrix<double>.super_TPZMatrix<double>.super_TPZBaseMatrix.
          super_TPZSavable._vptr_TPZSavable = (_func_int **)0x0;
          TPZFNMatrix<10,_double>::TPZFNMatrix(&rhsTemp,lStack_10c68,1,(double *)&rhsCopy);
          uVar13 = 0;
          uVar11 = uStack_10c40 & 0xffffffff;
          if ((int)uStack_10c40 < 1) {
            uVar11 = uVar13;
          }
          iVar2 = (int)uStack_10c98;
          uStack_10c98 = uStack_10c98 & 0xffffffff;
          if (iVar2 < 1) {
            uStack_10c98 = uVar13;
          }
          for (; uVar13 != uStack_10c98; uVar13 = uVar13 + 1) {
            TPZMatrix<double>::GetSub
                      ((TPZMatrix<double> *)&efTemp,uVar13 * lStack_10c68,0,lStack_10c68,1,
                       &rhsTemp.super_TPZFMatrix<double>);
            TPZFNMatrix<9,_double>::TPZFNMatrix(&rhsCopy,&rhsTemp.super_TPZFMatrix<double>);
            TPZMatrix<double>::Solve_LU
                      ((TPZMatrix<double> *)&ekTemp,&rhsTemp.super_TPZFMatrix<double>);
            row = uVar13;
            for (uVar12 = 0; uVar11 != uVar12; uVar12 = uVar12 + 1) {
              dStack_10c80 = rhsTemp.super_TPZFMatrix<double>.fElem[uVar12];
              pdVar10 = TPZFMatrix<double>::operator()((TPZFMatrix<double> *)pTStack_10c88,row,0);
              *pdVar10 = dStack_10c80;
              row = row + lStack_10c48;
            }
            TPZFNMatrix<9,_double>::~TPZFNMatrix(&rhsCopy);
          }
          TPZFNMatrix<10,_double>::~TPZFNMatrix(&rhsTemp);
          TPZFNMatrix<90,_double>::~TPZFNMatrix(&ekCopy);
          TPZVec<double>::~TPZVec(&Sol);
          TPZManVector<int,_10>::~TPZManVector(&varIndex);
          TPZFNMatrix<10,_double>::~TPZFNMatrix(&ekTemp);
        }
        else {
          poVar9 = std::operator<<((ostream *)&std::cerr,"Error at ");
          poVar9 = std::operator<<(poVar9,
                                   "void TPZCompElPostProc<TPZCompElH1<pzshape::TPZShapePoint>>::CalcResidualInternal(TPZElementMatrixT<TVar> &) [TCOMPEL = TPZCompElH1<pzshape::TPZShapePoint>, TVar = double]"
                                  );
          std::operator<<(poVar9," Referred CompEl with different number of integration points\n");
        }
        TPZManVector<double,_3>::~TPZManVector(&intpointRef);
        TPZManVector<double,_3>::~TPZManVector(&intpoint);
        TPZMaterialDataT<double>::~TPZMaterialDataT(&dataRef);
        TPZMaterialDataT<double>::~TPZMaterialDataT(&data);
        TPZFNMatrix<1,_double>::~TPZFNMatrix(&efTemp);
      }
      return;
    }
  }
  pzinternal::DebugStopImpl
            ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Post/pzcompelpostproc.h"
             ,0x103);
}

Assistant:

inline void TPZCompElPostProc<TCOMPEL>::CalcResidualInternal(TPZElementMatrixT<TVar> &ef)
{
    ef.Reset();
    
    this->InitializeElementMatrix(ef);
    
    TPZCompEl * pCompElRef = ReferredElement();
    
    TPZInterpolationSpace * pIntSpRef = dynamic_cast<TPZInterpolationSpace *>(pCompElRef);
    
    TPZMultiphysicsElement *pMultiRef = dynamic_cast<TPZMultiphysicsElement *>(pCompElRef);
    
    TPZPostProcMat * pPostProcMat = dynamic_cast<TPZPostProcMat *>(this->Material());
    
    if(!pPostProcMat) DebugStop();
    
    auto* pMaterialRef =
        dynamic_cast<TPZMatSingleSpaceT<STATE>*>(pCompElRef->Material());
    
    
    if (this->NConnects() == 0) return;///boundary discontinuous elements have this characteristic
    
    int64_t numeq = ef.fMat.Rows();
    TPZFNMatrix<1,STATE> efTemp(numeq,1,0.);
    
    TPZMaterialDataT<STATE> data, dataRef;
    this->InitMaterialData(data);
    if(pIntSpRef)
    {
        pIntSpRef->InitMaterialData(dataRef);
        dataRef.fNeedsSol = true;
        dataRef.p = pIntSpRef->MaxOrder();
    }
    data.p    = this->MaxOrder();
    int dim = this->Reference()->Dimension();
    TPZManVector<REAL,3> intpoint(dim,0.);
    TPZManVector<REAL,3> intpointRef(dim,0);
    REAL weight = 0.;
    REAL weightRef = 0;
  
    TPZIntPoints* pFIntegrationRule = &this->GetIntegrationRule();
    if (!pFIntegrationRule) {
        PZError << "Error at " << __PRETTY_FUNCTION__ << " Integration rule must be used from TPZCompEl. \n";
        DebugStop();
    }
    
    const TPZIntPoints &intrule    = this->GetIntegrationRule();
    const TPZIntPoints &intruleRef = pCompElRef->GetIntegrationRule();
    
    int intrulepoints = intrule.NPoints();
    int intrulepointsRef = intruleRef.NPoints();
    if(intrulepoints != intrulepointsRef)
    {
        PZError << "Error at " << __PRETTY_FUNCTION__ << " Referred CompEl with different number of integration points\n";
        return;
    }
    
    int nshape = this->NShapeF();
    TPZFNMatrix<10,STATE> ekTemp(nshape, nshape, 0.);
    
    TPZManVector<int,10> varIndex;
    pPostProcMat->GetPostProcessVarIndexList(varIndex);
    
    int stackedVarSize = pPostProcMat->NStateVariables();
    TPZVec<STATE> Sol;
    
    for(int int_ind = 0; int_ind < intrulepoints; ++int_ind)
    {
        intrule.   Point(int_ind,intpoint,   weight);
        intruleRef.Point(int_ind,intpointRef,weightRef);
        data   .intLocPtIndex = int_ind;
        dataRef.intLocPtIndex = int_ind;
        this->ComputeRequiredData(data,    intpoint);
        
        /*pIntSpRef ->ComputeShape(intpointRef, dataRef.x, dataRef.jacobian,
         dataRef.axes, dataRef.detjac, dataRef.jacinv,
         dataRef.phi, dataRef.dphix); */
        dataRef.intLocPtIndex = int_ind;
        if(pIntSpRef)
        {
            pIntSpRef->ComputeShape(intpointRef,dataRef);
            pIntSpRef->ComputeRequiredData(dataRef, intpointRef);
        }
        if(pMultiRef)
        {
            pMultiRef->ComputeRequiredData(dataRef, intpointRef);
        }
        weight    *= fabs(data.detjac);
        weightRef *= fabs(dataRef.detjac);
        
//        if(pIntSpRef)
//        {
//            if(!dataequal(data,dataRef)){
//                PZError << "Error at " << __PRETTY_FUNCTION__ << " this and Referred CompEl TPZMaterialData(s) do not match\n";
//                ef.Reset();
//                return;
//            }
//        }
        data.sol[0].Resize(stackedVarSize,0.);
        int64_t index = 0;
        // stacking the solutions to post process.
#ifdef PZ_LOG
        TPZLogger pzcompelpostproclogger("pz.mesh.TPZCompElPostProc");
        if(pzcompelpostproclogger.isDebugEnabled())
        {
            std::stringstream sout;
            sout << "Integration point " << int_ind << " x = " << dataRef.x << " GradSol = " << dataRef.dsol[0] ;
            LOGPZ_DEBUG(pzcompelpostproclogger, sout.str())
        }
#endif
        int n_var_indexes = varIndex.NElements();
        for(int var_ind = 0; var_ind < n_var_indexes; var_ind++)
        {
            int variableindex = varIndex[var_ind];
            int nsolvars = pCompElRef->Material()->NSolutionVariables(variableindex);
            Sol.Resize(nsolvars);

            // diferenca entre variavel de interpolacao e variavel de elemento
            if (variableindex < 99) {
                pMaterialRef->Solution(dataRef, variableindex, Sol);
            }
            else {
                pCompElRef->Solution(intpointRef, variableindex, Sol);
            }

#ifdef PZ_LOG
            if(pzcompelpostproclogger.isDebugEnabled())
            {
                std::stringstream sout;
                std::string varname;
                pPostProcMat->GetPostProcVarName(var_ind, varname);
                sout << varname << " -value- " << Sol;
                LOGPZ_DEBUG(pzcompelpostproclogger, sout.str())
            }
#endif
            for(int i = 0; i <nsolvars; i++) data.sol[0][index+i] = Sol[i];
            index += nsolvars;
        }
        
        pPostProcMat->Contribute(data,weight,ekTemp,efTemp);
        
    }//loop over integration points
    
    TPZFNMatrix<90,STATE> ekCopy(ekTemp);
    
    TPZFNMatrix<10,STATE> rhsTemp(nshape, 1, 0.);
    for(int i_st = 0; i_st < stackedVarSize; i_st++)
    {
        
        efTemp.GetSub(i_st*nshape, 0, nshape, 1, rhsTemp);
        
        TPZFNMatrix<9,STATE> rhsCopy(rhsTemp);
//        int status = ekTemp.Solve_Cholesky(&(rhsTemp));
        int status = ekTemp.Solve_LU(&(rhsTemp));
#ifdef PZDEBUG
        {
            TPZFNMatrix<9,STATE> result(nshape,1,0.);
            ekCopy.MultAdd(rhsTemp, rhsCopy, result, 1., -1.);
            REAL invRes = Norm(result);
            if(!status ){
                PZError << "Error at " << __PRETTY_FUNCTION__ << " Unable to solve the transference linear system\n";
                ef.Reset();
                return;
            }
            
            if(invRes > 1.e-7)
            {
                PZError << "Error at " << __PRETTY_FUNCTION__
                << " Transference linear system solved with residual norm = "
                << invRes << " at " << i_st << " export variable\n";
            }
        }
#endif
        for(int i_sh = 0; i_sh < nshape; i_sh++)
            ef.fMat(i_sh * stackedVarSize + i_st, 0) = rhsTemp(i_sh);
    }

#ifdef PZ_LOG2
    {
        std::stringstream sout;
        sout << "Element index " << this->fIndex << std::endl;
        ef.fMat.Print("Post Processed ",sout);
        LOGPZ_DEBUG(pzcompelpostproclogger, sout.str())
    }
#endif
    
}